

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

AActor * P_LineAttack(AActor *t1,DAngle *angle,double distance,DAngle *pitch,int damage,
                     FName *damageType,FName *pufftype,int flags,FTranslatedLineTarget *victim,
                     int *actualdamage)

{
  int damage_00;
  DAngle *distance_00;
  DAngle *t1_00;
  char *pcVar1;
  FName local_6c;
  TAngle<double> local_68;
  TAngle<double> local_60;
  FName local_54;
  PClassActor *local_50;
  PClassActor *type;
  FName *pufftype_local;
  FName *damageType_local;
  DAngle *pDStack_30;
  int damage_local;
  DAngle *pitch_local;
  double distance_local;
  DAngle *angle_local;
  AActor *t1_local;
  
  type = (PClassActor *)pufftype;
  pufftype_local = damageType;
  damageType_local._4_4_ = damage;
  pDStack_30 = pitch;
  pitch_local = (DAngle *)distance;
  distance_local = (double)angle;
  angle_local = (DAngle *)t1;
  FName::FName(&local_54,pufftype);
  local_50 = PClass::FindActor(&local_54);
  t1_00 = angle_local;
  if (local_50 == (PClassActor *)0x0) {
    if (victim != (FTranslatedLineTarget *)0x0) {
      memset(victim,0,0x18);
    }
    pcVar1 = FName::GetChars(pufftype);
    Printf("Attempt to spawn unknown actor type \'%s\'\n",pcVar1);
    t1_local = (AActor *)0x0;
  }
  else {
    TAngle<double>::TAngle(&local_60,angle);
    distance_00 = pitch_local;
    TAngle<double>::TAngle(&local_68,pitch);
    damage_00 = damageType_local._4_4_;
    FName::FName(&local_6c,damageType);
    t1_local = P_LineAttack((AActor *)t1_00,&local_60,(double)distance_00,&local_68,damage_00,
                            &local_6c,local_50,flags,victim,actualdamage);
  }
  return t1_local;
}

Assistant:

AActor *P_LineAttack(AActor *t1, DAngle angle, double distance,
	DAngle pitch, int damage, FName damageType, FName pufftype, int flags, FTranslatedLineTarget *victim, int *actualdamage)
{
	PClassActor *type = PClass::FindActor(pufftype);
	if (type == NULL)
	{
		if (victim != NULL)
		{
			memset(victim, 0, sizeof(*victim));
		}
		Printf("Attempt to spawn unknown actor type '%s'\n", pufftype.GetChars());
		return NULL;
	}
	else
	{
		return P_LineAttack(t1, angle, distance, pitch, damage, damageType, type, flags, victim, actualdamage);
	}
}